

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_1ca509f::DirectoryObject::DumpInstaller
          (Value *__return_storage_ptr__,DirectoryObject *this,cmInstallGenerator *gen)

{
  Comments *pCVar1;
  cmExportSet *exp;
  pointer pcVar2;
  string *psVar3;
  bool bVar4;
  size_type sVar5;
  cmInstallGenerator *pcVar6;
  cmFileSet *pcVar7;
  bool bVar8;
  int iVar9;
  JBTIndex value;
  long lVar10;
  cmInstallDirectoryGenerator *pcVar11;
  Value *pVVar12;
  mapped_type *pmVar13;
  cmInstallFilesGenerator *this_00;
  cmInstallScriptGenerator *this_01;
  cmInstallImportedRuntimeArtifactsGenerator *this_02;
  cmInstallRuntimeDependencySetGenerator *this_03;
  cmLocalGenerator *lg;
  cmLocalGenerator *lg_00;
  cmInstallCxxModuleBmiGenerator *this_04;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entryCge;
  pointer cge;
  string *psVar14;
  pointer in;
  ValueHolder VVar15;
  string *in_R8;
  ulong uVar16;
  _Alloc_hider _Var17;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  basic_string_view<char,_std::char_traits<char>_> __str;
  Value paths;
  cmGeneratorTarget *target_1;
  pointer local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  string fromDir;
  string toDir;
  Value paths_1;
  _Alloc_hider local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  NamelinkModeType local_f0;
  cmInstallGenerator *local_e0;
  cmGeneratorTarget *target;
  cmInstallDirectoryGenerator *local_d0;
  cmFileSet *local_c8;
  undefined1 local_c0 [32];
  cmInstallFileSetGenerator *local_a0;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  entryCges;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  dirCges;
  
  if (gen == (cmInstallGenerator *)0x0) {
    __assert_fail("gen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFileAPICodemodel.cxx"
                  ,0x373,
                  "Json::Value (anonymous namespace)::DirectoryObject::DumpInstaller(cmInstallGenerator *)"
                 );
  }
  Json::Value::Value(__return_storage_ptr__,objectValue);
  lVar10 = __dynamic_cast(gen,&cmInstallGenerator::typeinfo,
                          &cmInstallSubdirectoryGenerator::typeinfo,0);
  if (lVar10 != 0) {
    return __return_storage_ptr__;
  }
  lVar10 = __dynamic_cast(gen,&cmInstallGenerator::typeinfo,
                          &cmInstallGetRuntimeDependenciesGenerator::typeinfo,0);
  if (lVar10 != 0) {
    return __return_storage_ptr__;
  }
  bVar8 = cmInstallGenerator::InstallsForConfig(gen,this->Config);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  pcVar11 = (cmInstallDirectoryGenerator *)
            __dynamic_cast(gen,&cmInstallGenerator::typeinfo,&cmInstallTargetGenerator::typeinfo,0);
  local_e0 = gen;
  if (pcVar11 == (cmInstallDirectoryGenerator *)0x0) {
    this_00 = (cmInstallFilesGenerator *)
              __dynamic_cast(gen,&cmInstallGenerator::typeinfo,&cmInstallFilesGenerator::typeinfo,0)
    ;
    if (this_00 != (cmInstallFilesGenerator *)0x0) {
      cmInstallFilesGenerator::GetFiles
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&toDir,this_00,this->Config);
      if (toDir._M_dataplus._M_p == (pointer)toDir._M_string_length) {
LAB_0048e1b4:
        pVVar12 = (Value *)&toDir;
        goto LAB_0048e1bc;
      }
      Json::Value::Value(&paths_1,"file");
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"type");
      Json::Value::operator=(pVVar12,&paths_1);
      Json::Value::~Value(&paths_1);
      cmInstallFilesGenerator::GetDestination((string *)&paths,this_00,this->Config);
      Json::Value::Value(&paths_1,(String *)&paths);
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"destination");
      Json::Value::operator=(pVVar12,&paths_1);
      Json::Value::~Value(&paths_1);
      if (paths.value_ != &paths.comments_) {
        operator_delete(paths.value_.string_,
                        (long)paths.comments_.ptr_._M_t.
                              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                              .
                              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                              ._M_head_impl + 1);
      }
      Json::Value::Value(&paths_1,arrayValue);
      cmInstallFilesGenerator::GetRename((string *)&target_1,this_00,this->Config);
      if ((local_1c8 == (pointer)0x0) ||
         (toDir._M_string_length - (long)toDir._M_dataplus._M_p != 0x20)) {
        cmInstallFilesGenerator::GetFiles
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c0,this_00,this->Config);
        if (local_c0._0_8_ != local_c0._8_8_) {
          psVar14 = (string *)local_c0._0_8_;
          do {
            cmSystemTools::RelativeIfUnder(&fromDir,&this->TopSource,psVar14);
            Json::Value::Value(&paths,&fromDir);
            Json::Value::append(&paths_1,&paths);
            Json::Value::~Value(&paths);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fromDir._M_dataplus._M_p != &fromDir.field_2) {
              operator_delete(fromDir._M_dataplus._M_p,fromDir.field_2._M_allocated_capacity + 1);
            }
            psVar14 = psVar14 + 1;
          } while (psVar14 != (string *)local_c0._8_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c0);
      }
      else {
        DumpInstallerPath(&paths,(DirectoryObject *)&this->TopSource,
                          (string *)toDir._M_dataplus._M_p,(string *)&target_1,in_R8);
        Json::Value::append(&paths_1,&paths);
        Json::Value::~Value(&paths);
      }
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"paths");
      Json::Value::operator=(pVVar12,&paths_1);
      if (this_00->Optional == true) {
        Json::Value::Value(&paths,true);
        pVVar12 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
        Json::Value::operator=(pVVar12,&paths);
        Json::Value::~Value(&paths);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)target_1 != &local_1c0) {
        operator_delete(target_1,(ulong)(local_1c0._M_allocated_capacity + 1));
      }
LAB_0048dfce:
      Json::Value::~Value(&paths_1);
      pVVar12 = (Value *)&toDir;
      goto LAB_0048dfe3;
    }
    pcVar11 = (cmInstallDirectoryGenerator *)
              __dynamic_cast(gen,&cmInstallGenerator::typeinfo,
                             &cmInstallDirectoryGenerator::typeinfo,0);
    if (pcVar11 != (cmInstallDirectoryGenerator *)0x0) {
      cmInstallDirectoryGenerator::GetDirectories
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&toDir,pcVar11,this->Config);
      if (toDir._M_dataplus._M_p == (pointer)toDir._M_string_length) goto LAB_0048e1b4;
      Json::Value::Value(&paths_1,"directory");
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"type");
      Json::Value::operator=(pVVar12,&paths_1);
      Json::Value::~Value(&paths_1);
      cmInstallDirectoryGenerator::GetDestination((string *)&paths,pcVar11,this->Config);
      Json::Value::Value(&paths_1,(String *)&paths);
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"destination");
      Json::Value::operator=(pVVar12,&paths_1);
      Json::Value::~Value(&paths_1);
      if (paths.value_ != &paths.comments_) {
        operator_delete(paths.value_.string_,
                        (long)paths.comments_.ptr_._M_t.
                              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                              .
                              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                              ._M_head_impl + 1);
      }
      local_d0 = pcVar11;
      Json::Value::Value(&paths_1,arrayValue);
      if (toDir._M_dataplus._M_p != (pointer)toDir._M_string_length) {
        _Var17 = toDir._M_dataplus;
        do {
          paths._8_8_ = (((string *)_Var17._M_p)->_M_dataplus)._M_p;
          paths.value_ = (ValueHolder)((string *)_Var17._M_p)->_M_string_length;
          if (paths.value_.int_ == 0) {
LAB_0048dc54:
            cmsys::SystemTools::GetFilenameName((string *)&target_1,(string *)_Var17._M_p);
            DumpInstallerPath(&paths,(DirectoryObject *)&this->TopSource,(string *)_Var17._M_p,
                              (string *)&target_1,in_R8);
            Json::Value::append(&paths_1,&paths);
            Json::Value::~Value(&paths);
          }
          else {
            __str._M_str = "/";
            __str._M_len = 1;
            in_R8 = (string *)0x7cb192;
            iVar9 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)&paths,
                               paths.value_.int_ - 1,1,__str);
            if (iVar9 != 0) goto LAB_0048dc54;
            std::__cxx11::string::substr((ulong)&target_1,(ulong)_Var17._M_p);
            fromDir._M_dataplus._M_p = (pointer)&fromDir.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&fromDir,".","");
            DumpInstallerPath(&paths,(DirectoryObject *)&this->TopSource,(string *)&target_1,
                              &fromDir,in_R8);
            Json::Value::append(&paths_1,&paths);
            Json::Value::~Value(&paths);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fromDir._M_dataplus._M_p != &fromDir.field_2) {
              operator_delete(fromDir._M_dataplus._M_p,fromDir.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)target_1 != &local_1c0) {
            operator_delete(target_1,(ulong)(local_1c0._M_allocated_capacity + 1));
          }
          _Var17._M_p = _Var17._M_p + 0x20;
        } while (_Var17._M_p != (pointer)toDir._M_string_length);
      }
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"paths");
      Json::Value::operator=(pVVar12,&paths_1);
      if (local_d0->Optional == true) {
        Json::Value::Value(&paths,true);
        pVVar12 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
        Json::Value::operator=(pVVar12,&paths);
        Json::Value::~Value(&paths);
      }
      goto LAB_0048dfce;
    }
    lVar10 = __dynamic_cast(gen,&cmInstallGenerator::typeinfo,&cmInstallExportGenerator::typeinfo,0)
    ;
    if (lVar10 == 0) {
      this_01 = (cmInstallScriptGenerator *)
                __dynamic_cast(gen,&cmInstallGenerator::typeinfo,&cmInstallScriptGenerator::typeinfo
                               ,0);
      if (this_01 == (cmInstallScriptGenerator *)0x0) {
        this_02 = (cmInstallImportedRuntimeArtifactsGenerator *)
                  __dynamic_cast(gen,&cmInstallGenerator::typeinfo,
                                 &cmInstallImportedRuntimeArtifactsGenerator::typeinfo,0);
        pcVar6 = local_e0;
        if (this_02 != (cmInstallImportedRuntimeArtifactsGenerator *)0x0) {
          Json::Value::Value(&paths_1,"importedRuntimeArtifacts");
          pVVar12 = Json::Value::operator[](__return_storage_ptr__,"type");
          Json::Value::operator=(pVVar12,&paths_1);
          Json::Value::~Value(&paths_1);
          cmInstallImportedRuntimeArtifactsGenerator::GetDestination
                    ((string *)&paths,this_02,this->Config);
          Json::Value::Value(&paths_1,(String *)&paths);
          pVVar12 = Json::Value::operator[](__return_storage_ptr__,"destination");
          Json::Value::operator=(pVVar12,&paths_1);
          Json::Value::~Value(&paths_1);
          if (paths.value_ != &paths.comments_) {
            operator_delete(paths.value_.string_,
                            (long)paths.comments_.ptr_._M_t.
                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  .
                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                  ._M_head_impl + 1);
          }
          if (this_02->Optional == true) {
            Json::Value::Value(&paths_1,true);
            pVVar12 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
            Json::Value::operator=(pVVar12,&paths_1);
            Json::Value::~Value(&paths_1);
          }
          goto LAB_0048dfeb;
        }
        this_03 = (cmInstallRuntimeDependencySetGenerator *)
                  __dynamic_cast(local_e0,&cmInstallGenerator::typeinfo,
                                 &cmInstallRuntimeDependencySetGenerator::typeinfo,0);
        if (this_03 == (cmInstallRuntimeDependencySetGenerator *)0x0) {
          local_a0 = (cmInstallFileSetGenerator *)
                     __dynamic_cast(pcVar6,&cmInstallGenerator::typeinfo,
                                    &cmInstallFileSetGenerator::typeinfo,0);
          if (local_a0 == (cmInstallFileSetGenerator *)0x0) {
            this_04 = (cmInstallCxxModuleBmiGenerator *)
                      __dynamic_cast(local_e0,&cmInstallGenerator::typeinfo,
                                     &cmInstallCxxModuleBmiGenerator::typeinfo,0);
            if (this_04 != (cmInstallCxxModuleBmiGenerator *)0x0) {
              Json::Value::Value(&paths_1,"cxxModuleBmi");
              pVVar12 = Json::Value::operator[](__return_storage_ptr__,"type");
              Json::Value::operator=(pVVar12,&paths_1);
              Json::Value::~Value(&paths_1);
              cmInstallCxxModuleBmiGenerator::GetDestination((string *)&paths,this_04,this->Config);
              Json::Value::Value(&paths_1,(String *)&paths);
              pVVar12 = Json::Value::operator[](__return_storage_ptr__,"destination");
              Json::Value::operator=(pVVar12,&paths_1);
              Json::Value::~Value(&paths_1);
              if (paths.value_ != &paths.comments_) {
                operator_delete(paths.value_.string_,
                                (long)paths.comments_.ptr_._M_t.
                                      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                      .
                                      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                      ._M_head_impl + 1);
              }
              target_1 = this_04->Target;
              Json::Value::Value(&paths_1,objectValue);
              pVVar12 = Json::Value::operator[](__return_storage_ptr__,"cxxModuleBmiTarget");
              Json::Value::operator=(pVVar12,&paths_1);
              Json::Value::~Value(&paths_1);
              TargetId((string *)&paths,target_1,&this->TopBuild);
              Json::Value::Value(&paths_1,(String *)&paths);
              pVVar12 = Json::Value::operator[](__return_storage_ptr__,"cxxModuleBmiTarget");
              pVVar12 = Json::Value::operator[](pVVar12,"id");
              Json::Value::operator=(pVVar12,&paths_1);
              Json::Value::~Value(&paths_1);
              if (paths.value_ != &paths.comments_) {
                operator_delete(paths.value_.string_,
                                (long)paths.comments_.ptr_._M_t.
                                      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                      .
                                      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                      ._M_head_impl + 1);
              }
              pmVar13 = std::__detail::
                        _Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)this->TargetIndexMap,&target_1);
              Json::Value::Value(&paths_1,*pmVar13);
              pVVar12 = Json::Value::operator[](__return_storage_ptr__,"cxxModuleBmiTarget");
              pVVar12 = Json::Value::operator[](pVVar12,"index");
              Json::Value::operator=(pVVar12,&paths_1);
              Json::Value::~Value(&paths_1);
              if (this_04->Optional == true) {
                Json::Value::Value(&paths_1,true);
                pVVar12 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
                Json::Value::operator=(pVVar12,&paths_1);
                Json::Value::~Value(&paths_1);
              }
            }
          }
          else {
            Json::Value::Value(&paths_1,"fileSet");
            pVVar12 = Json::Value::operator[](__return_storage_ptr__,"type");
            Json::Value::operator=(pVVar12,&paths_1);
            Json::Value::~Value(&paths_1);
            cmInstallFileSetGenerator::GetDestination((string *)&paths,local_a0,this->Config);
            Json::Value::Value(&paths_1,(String *)&paths);
            pVVar12 = Json::Value::operator[](__return_storage_ptr__,"destination");
            Json::Value::operator=(pVVar12,&paths_1);
            Json::Value::~Value(&paths_1);
            if (paths.value_ != &paths.comments_) {
              operator_delete(paths.value_.string_,
                              (long)paths.comments_.ptr_._M_t.
                                    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                    .
                                    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                    ._M_head_impl + 1);
            }
            local_c8 = local_a0->FileSet;
            target = local_a0->Target;
            cmFileSet::CompileDirectoryEntries(&dirCges,local_c8);
            lg = cmGeneratorTarget::GetLocalGenerator(target);
            pcVar7 = local_c8;
            lg_00 = (cmLocalGenerator *)this->Config;
            cmFileSet::EvaluateDirectoryEntries
                      (&dirs,local_c8,&dirCges,lg,(string *)lg_00,target,
                       (cmGeneratorExpressionDAGChecker *)0x0);
            cmFileSet::CompileFileEntries(&entryCges,pcVar7);
            pcVar7 = local_c8;
            paths_1.start_ = (ptrdiff_t)&paths_1.bits_;
            paths_1.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
            paths_1.comments_.ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                    )0x0;
            paths_1.limit_ = paths_1.start_;
            if (entryCges.
                super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                entryCges.
                super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              cge = entryCges.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
              do {
                lg_00 = cmGeneratorTarget::GetLocalGenerator(target);
                cmFileSet::EvaluateFileEntry
                          (pcVar7,&dirs,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            *)&paths_1,cge,lg_00,this->Config,target,
                           (cmGeneratorExpressionDAGChecker *)0x0);
                cge = cge + 1;
              } while (cge != entryCges.
                              super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
            }
            Json::Value::Value(&paths,arrayValue);
            if ((anon_struct_4_2_14fb5ae2_for_bits_ *)paths_1.start_ != &paths_1.bits_) {
              pcVar11 = (cmInstallDirectoryGenerator *)paths_1.start_;
              do {
                toDir._M_dataplus._M_p = (pointer)&toDir.field_2;
                lVar10 = *(long *)((long)&(pcVar11->super_cmInstallGenerator).
                                          super_cmScriptGenerator.RuntimeConfigVariable.field_2 + 8)
                ;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&toDir,lVar10,
                           (long)&(((pcVar11->super_cmInstallGenerator).super_cmScriptGenerator.
                                    Configurations.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar10);
                if (toDir._M_string_length != 0) {
                  std::__cxx11::string::push_back((char)&toDir);
                }
                psVar3 = (string *)
                         (pcVar11->super_cmInstallGenerator).super_cmScriptGenerator.
                         ConfigurationName._M_string_length;
                local_d0 = pcVar11;
                for (psVar14 = (string *)
                               (pcVar11->super_cmInstallGenerator).super_cmScriptGenerator.
                               ConfigurationName._M_dataplus._M_p; sVar5 = toDir._M_string_length,
                    _Var17._M_p = toDir._M_dataplus._M_p, psVar14 != psVar3; psVar14 = psVar14 + 1)
                {
                  cmsys::SystemTools::GetFilenameName(&local_98,psVar14);
                  fromDir._M_dataplus._M_p = (pointer)sVar5;
                  fromDir._M_string_length = (size_type)_Var17._M_p;
                  fromDir.field_2._M_allocated_capacity = local_98._M_string_length;
                  fromDir.field_2._8_8_ = local_98._M_dataplus._M_p;
                  views_01._M_len = 2;
                  views_01._M_array = (iterator)&fromDir;
                  cmCatViews_abi_cxx11_((string *)local_c0,views_01);
                  DumpInstallerPath((Value *)&target_1,(DirectoryObject *)&this->TopSource,psVar14,
                                    (string *)local_c0,(string *)lg_00);
                  Json::Value::append(&paths,(Value *)&target_1);
                  Json::Value::~Value((Value *)&target_1);
                  if ((string *)local_c0._0_8_ != (string *)(local_c0 + 0x10)) {
                    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_98._M_dataplus._M_p != &local_98.field_2) {
                    operator_delete(local_98._M_dataplus._M_p,
                                    local_98.field_2._M_allocated_capacity + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)toDir._M_dataplus._M_p != &toDir.field_2) {
                  operator_delete(toDir._M_dataplus._M_p,toDir.field_2._M_allocated_capacity + 1);
                }
                pcVar11 = (cmInstallDirectoryGenerator *)
                          std::_Rb_tree_increment((_Rb_tree_node_base *)local_d0);
              } while (pcVar11 != (cmInstallDirectoryGenerator *)&paths_1.bits_);
            }
            pVVar12 = Json::Value::operator[](__return_storage_ptr__,"paths");
            Json::Value::operator=(pVVar12,&paths);
            Json::Value::Value((Value *)&target_1,&local_c8->Name);
            pVVar12 = Json::Value::operator[](__return_storage_ptr__,"fileSetName");
            Json::Value::operator=(pVVar12,(Value *)&target_1);
            Json::Value::~Value((Value *)&target_1);
            Json::Value::Value((Value *)&target_1,&local_c8->Type);
            pVVar12 = Json::Value::operator[](__return_storage_ptr__,"fileSetType");
            Json::Value::operator=(pVVar12,(Value *)&target_1);
            Json::Value::~Value((Value *)&target_1);
            Json::Value::Value((Value *)&target_1,arrayValue);
            pVVar12 = Json::Value::operator[](__return_storage_ptr__,"fileSetDirectories");
            Json::Value::operator=(pVVar12,(Value *)&target_1);
            Json::Value::~Value((Value *)&target_1);
            if (dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              in = dirs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              do {
                pVVar12 = Json::Value::operator[](__return_storage_ptr__,"fileSetDirectories");
                cmSystemTools::RelativeIfUnder(&fromDir,&this->TopSource,in);
                Json::Value::Value((Value *)&target_1,&fromDir);
                Json::Value::append(pVVar12,(Value *)&target_1);
                Json::Value::~Value((Value *)&target_1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)fromDir._M_dataplus._M_p != &fromDir.field_2) {
                  operator_delete(fromDir._M_dataplus._M_p,fromDir.field_2._M_allocated_capacity + 1
                                 );
                }
                in = in + 1;
              } while (in != dirs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
            }
            Json::Value::Value((Value *)&target_1,objectValue);
            pVVar12 = Json::Value::operator[](__return_storage_ptr__,"fileSetTarget");
            Json::Value::operator=(pVVar12,(Value *)&target_1);
            Json::Value::~Value((Value *)&target_1);
            TargetId(&fromDir,target,&this->TopBuild);
            Json::Value::Value((Value *)&target_1,&fromDir);
            pVVar12 = Json::Value::operator[](__return_storage_ptr__,"fileSetTarget");
            pVVar12 = Json::Value::operator[](pVVar12,"id");
            Json::Value::operator=(pVVar12,(Value *)&target_1);
            Json::Value::~Value((Value *)&target_1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fromDir._M_dataplus._M_p != &fromDir.field_2) {
              operator_delete(fromDir._M_dataplus._M_p,fromDir.field_2._M_allocated_capacity + 1);
            }
            pmVar13 = std::__detail::
                      _Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this->TargetIndexMap,&target);
            Json::Value::Value((Value *)&target_1,*pmVar13);
            pVVar12 = Json::Value::operator[](__return_storage_ptr__,"fileSetTarget");
            pVVar12 = Json::Value::operator[](pVVar12,"index");
            Json::Value::operator=(pVVar12,(Value *)&target_1);
            Json::Value::~Value((Value *)&target_1);
            if (local_a0->Optional == true) {
              Json::Value::Value((Value *)&target_1,true);
              pVVar12 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
              Json::Value::operator=(pVVar12,(Value *)&target_1);
              Json::Value::~Value((Value *)&target_1);
            }
            Json::Value::~Value(&paths);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)&paths_1);
            std::
            vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
            ::~vector(&entryCges);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&dirs);
            std::
            vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
            ::~vector(&dirCges);
          }
          bVar4 = false;
          bVar8 = true;
          goto LAB_0048e1c5;
        }
        Json::Value::Value(&paths_1,"runtimeDependencySet");
        pVVar12 = Json::Value::operator[](__return_storage_ptr__,"type");
        Json::Value::operator=(pVVar12,&paths_1);
        Json::Value::~Value(&paths_1);
        cmInstallRuntimeDependencySetGenerator::GetDestination
                  ((string *)&paths,this_03,this->Config);
        Json::Value::Value(&paths_1,(String *)&paths);
        pVVar12 = Json::Value::operator[](__return_storage_ptr__,"destination");
        Json::Value::operator=(pVVar12,&paths_1);
        Json::Value::~Value(&paths_1);
        pCVar1 = &paths.comments_;
        if (paths.value_ != pCVar1) {
          operator_delete(paths.value_.string_,
                          (long)paths.comments_.ptr_._M_t.
                                super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                .
                                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                ._M_head_impl + 1);
        }
        pcVar2 = (this_03->DependencySet->Name)._M_dataplus._M_p;
        paths.value_ = (ValueHolder)pCVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&paths,pcVar2,pcVar2 + (this_03->DependencySet->Name)._M_string_length)
        ;
        if (paths._8_8_ != 0) {
          Json::Value::Value(&paths_1,(String *)&paths);
          pVVar12 = Json::Value::operator[](__return_storage_ptr__,"runtimeDependencySetName");
          Json::Value::operator=(pVVar12,&paths_1);
          Json::Value::~Value(&paths_1);
        }
        if (this_03->Type == Library) {
          Json::Value::Value(&paths_1,"library");
          pVVar12 = Json::Value::operator[](__return_storage_ptr__,"runtimeDependencySetType");
LAB_0048edc6:
          Json::Value::operator=(pVVar12,&paths_1);
          Json::Value::~Value(&paths_1);
        }
        else if (this_03->Type == Framework) {
          Json::Value::Value(&paths_1,"framework");
          pVVar12 = Json::Value::operator[](__return_storage_ptr__,"runtimeDependencySetType");
          goto LAB_0048edc6;
        }
        VVar15 = paths.value_;
        if (paths.value_ == pCVar1) goto LAB_0048dfeb;
      }
      else {
        if (this_01->Code == true) {
          Json::Value::Value(&paths_1,"code");
          pVVar12 = Json::Value::operator[](__return_storage_ptr__,"type");
          goto LAB_0048e194;
        }
        Json::Value::Value(&paths_1,"script");
        pVVar12 = Json::Value::operator[](__return_storage_ptr__,"type");
        Json::Value::operator=(pVVar12,&paths_1);
        Json::Value::~Value(&paths_1);
        cmInstallScriptGenerator::GetScript((string *)&target_1,this_01,this->Config);
        cmSystemTools::RelativeIfUnder((string *)&paths,&this->TopSource,(string *)&target_1);
        Json::Value::Value(&paths_1,(String *)&paths);
        pVVar12 = Json::Value::operator[](__return_storage_ptr__,"scriptFile");
        Json::Value::operator=(pVVar12,&paths_1);
        Json::Value::~Value(&paths_1);
        if (paths.value_ != &paths.comments_) {
          operator_delete(paths.value_.string_,
                          (long)paths.comments_.ptr_._M_t.
                                super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                .
                                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                ._M_head_impl + 1);
        }
        paths.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl =
             (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              )(unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                )local_1c0._M_allocated_capacity;
        VVar15 = (ValueHolder)target_1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)target_1 == &local_1c0) goto LAB_0048dfeb;
      }
      operator_delete(VVar15.string_,
                      (long)paths.comments_.ptr_._M_t.
                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            .
                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                            ._M_head_impl + 1);
    }
    else {
      Json::Value::Value(&paths_1,"export");
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"type");
      Json::Value::operator=(pVVar12,&paths_1);
      Json::Value::~Value(&paths_1);
      Json::Value::Value(&paths_1,(String *)(lVar10 + 0x70));
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"destination");
      Json::Value::operator=(pVVar12,&paths_1);
      Json::Value::~Value(&paths_1);
      exp = *(cmExportSet **)(lVar10 + 200);
      Json::Value::Value(&paths_1,&exp->Name);
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"exportName");
      Json::Value::operator=(pVVar12,&paths_1);
      Json::Value::~Value(&paths_1);
      DumpInstallerExportTargets(&paths_1,this,exp);
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"exportTargets");
      Json::Value::operator=(pVVar12,&paths_1);
      Json::Value::~Value(&paths_1);
      Json::Value::Value(&paths_1,arrayValue);
      cmSystemTools::RelativeIfUnder((string *)&target_1,&this->TopBuild,(string *)(lVar10 + 0x180))
      ;
      Json::Value::Value(&paths,(String *)&target_1);
      Json::Value::append(&paths_1,&paths);
      Json::Value::~Value(&paths);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)target_1 != &local_1c0) {
        operator_delete(target_1,(ulong)(local_1c0._M_allocated_capacity + 1));
      }
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"paths");
LAB_0048e194:
      Json::Value::operator=(pVVar12,&paths_1);
      Json::Value::~Value(&paths_1);
    }
  }
  else {
    cmInstallTargetGenerator::GetFiles
              ((Files *)&paths_1,(cmInstallTargetGenerator *)pcVar11,this->Config);
    if (paths_1.value_.int_ == CONCAT44(paths_1._12_4_,paths_1.bits_)) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_p != &local_100) {
        operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_p != &local_120) {
        operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&paths_1.start_);
      pVVar12 = &paths_1;
LAB_0048e1bc:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)pVVar12);
      bVar4 = true;
      bVar8 = false;
      goto LAB_0048e1c5;
    }
    Json::Value::Value(&paths,"target");
    pVVar12 = Json::Value::operator[](__return_storage_ptr__,"type");
    Json::Value::operator=(pVVar12,&paths);
    Json::Value::~Value(&paths);
    cmInstallTargetGenerator::GetDestination
              ((string *)&target_1,(cmInstallTargetGenerator *)pcVar11,this->Config);
    Json::Value::Value(&paths,(String *)&target_1);
    pVVar12 = Json::Value::operator[](__return_storage_ptr__,"destination");
    Json::Value::operator=(pVVar12,&paths);
    Json::Value::~Value(&paths);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)target_1 != &local_1c0) {
      operator_delete(target_1,(ulong)(local_1c0._M_allocated_capacity + 1));
    }
    TargetId((string *)&target_1,(cmGeneratorTarget *)(pcVar11->FilePermissions)._M_dataplus._M_p,
             &this->TopBuild);
    Json::Value::Value(&paths,(String *)&target_1);
    pVVar12 = Json::Value::operator[](__return_storage_ptr__,"targetId");
    Json::Value::operator=(pVVar12,&paths);
    Json::Value::~Value(&paths);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)target_1 != &local_1c0) {
      operator_delete(target_1,(ulong)(local_1c0._M_allocated_capacity + 1));
    }
    target_1 = (cmGeneratorTarget *)(pcVar11->FilePermissions)._M_dataplus._M_p;
    pmVar13 = std::__detail::
              _Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this->TargetIndexMap,&target_1);
    Json::Value::Value(&paths,*pmVar13);
    pVVar12 = Json::Value::operator[](__return_storage_ptr__,"targetIndex");
    Json::Value::operator=(pVVar12,&paths);
    Json::Value::~Value(&paths);
    fromDir._M_dataplus._M_p = (pointer)&fromDir.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fromDir,local_130._M_p,local_130._M_p + local_128);
    if (fromDir._M_string_length != 0) {
      std::__cxx11::string::push_back((char)&fromDir);
    }
    toDir._M_dataplus._M_p = (pointer)&toDir.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&toDir,local_110._M_p,local_110._M_p + local_108);
    local_d0 = pcVar11;
    if (toDir._M_string_length != 0) {
      std::__cxx11::string::push_back((char)&toDir);
    }
    Json::Value::Value(&paths,arrayValue);
    if (CONCAT44(paths_1._12_4_,paths_1.bits_) != paths_1.value_.int_) {
      lVar10 = 8;
      uVar16 = 0;
      do {
        local_1c0._8_8_ = *(undefined8 *)(paths_1.value_.int_ + -8 + lVar10);
        local_1c0._M_allocated_capacity = *(undefined8 *)(paths_1.value_.string_ + lVar10);
        target_1 = (cmGeneratorTarget *)fromDir._M_string_length;
        local_1c8 = fromDir._M_dataplus._M_p;
        views._M_len = 2;
        views._M_array = (iterator)&target_1;
        cmCatViews_abi_cxx11_((string *)local_c0,views);
        local_1c0._8_8_ = *(undefined8 *)(paths_1.start_ + -8 + lVar10);
        local_1c0._M_allocated_capacity = *(long *)(paths_1.start_ + lVar10);
        target_1 = (cmGeneratorTarget *)toDir._M_string_length;
        local_1c8 = toDir._M_dataplus._M_p;
        views_00._M_len = 2;
        views_00._M_array = (iterator)&target_1;
        cmCatViews_abi_cxx11_(&local_98,views_00);
        DumpInstallerPath((Value *)&target_1,(DirectoryObject *)&this->TopBuild,(string *)local_c0,
                          &local_98,in_R8);
        Json::Value::append(&paths,(Value *)&target_1);
        Json::Value::~Value((Value *)&target_1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((string *)local_c0._0_8_ != (string *)(local_c0 + 0x10)) {
          operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
        }
        uVar16 = uVar16 + 1;
        lVar10 = lVar10 + 0x20;
      } while (uVar16 < (ulong)(CONCAT44(paths_1._12_4_,paths_1.bits_) - (long)paths_1.value_ >> 5))
      ;
    }
    pVVar12 = Json::Value::operator[](__return_storage_ptr__,"paths");
    Json::Value::operator=(pVVar12,&paths);
    pcVar11 = local_d0;
    if (*(char *)((long)&(local_d0->DirPermissions)._M_string_length + 5) == '\x01') {
      Json::Value::Value((Value *)&target_1,true);
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"isOptional");
      Json::Value::operator=(pVVar12,(Value *)&target_1);
      Json::Value::~Value((Value *)&target_1);
    }
    if (*(char *)((long)&(pcVar11->DirPermissions)._M_string_length + 4) == '\x01') {
      Json::Value::Value((Value *)&target_1,true);
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"targetIsImportLibrary");
      Json::Value::operator=(pVVar12,(Value *)&target_1);
      Json::Value::~Value((Value *)&target_1);
    }
    if (local_f0 == NamelinkModeSkip) {
      Json::Value::Value((Value *)&target_1,"skip");
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"targetInstallNamelink");
LAB_0048dd63:
      Json::Value::operator=(pVVar12,(Value *)&target_1);
      Json::Value::~Value((Value *)&target_1);
    }
    else if (local_f0 == NamelinkModeOnly) {
      Json::Value::Value((Value *)&target_1,"only");
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"targetInstallNamelink");
      goto LAB_0048dd63;
    }
    Json::Value::~Value(&paths);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)toDir._M_dataplus._M_p != &toDir.field_2) {
      operator_delete(toDir._M_dataplus._M_p,toDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fromDir._M_dataplus._M_p != &fromDir.field_2) {
      operator_delete(fromDir._M_dataplus._M_p,fromDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_p != &local_100) {
      operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_p != &local_120) {
      operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&paths_1.start_);
    pVVar12 = &paths_1;
LAB_0048dfe3:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pVVar12);
  }
LAB_0048dfeb:
  bVar8 = true;
  bVar4 = false;
LAB_0048e1c5:
  if (bVar8) {
    Json::Value::Value(&paths_1,&local_e0->Component);
    pVVar12 = Json::Value::operator[](__return_storage_ptr__,"component");
    Json::Value::operator=(pVVar12,&paths_1);
    Json::Value::~Value(&paths_1);
    if (local_e0->ExcludeFromAll == true) {
      Json::Value::Value(&paths_1,true);
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"isExcludeFromAll");
      Json::Value::operator=(pVVar12,&paths_1);
      Json::Value::~Value(&paths_1);
    }
    if (local_e0->AllComponents == true) {
      Json::Value::Value(&paths_1,true);
      pVVar12 = Json::Value::operator[](__return_storage_ptr__,"isForAllComponents");
      Json::Value::operator=(pVVar12,&paths_1);
      Json::Value::~Value(&paths_1);
    }
    value = BacktraceData::Add(&this->Backtraces,&local_e0->Backtrace);
    if (value.Index == 0xffffffff) {
      return __return_storage_ptr__;
    }
    Json::Value::Value(&paths_1,value.Index);
    pVVar12 = Json::Value::operator[](__return_storage_ptr__,"backtrace");
    Json::Value::operator=(pVVar12,&paths_1);
    pVVar12 = &paths_1;
  }
  else {
    pVVar12 = __return_storage_ptr__;
    if (bVar4) {
      return __return_storage_ptr__;
    }
  }
  Json::Value::~Value(pVVar12);
  return __return_storage_ptr__;
}

Assistant:

Json::Value DirectoryObject::DumpInstaller(cmInstallGenerator* gen)
{
  assert(gen);
  Json::Value installer = Json::objectValue;

  // Exclude subdirectory installers and file(GET_RUNTIME_DEPENDENCIES)
  // installers. They are implementation details.
  if (dynamic_cast<cmInstallSubdirectoryGenerator*>(gen) ||
      dynamic_cast<cmInstallGetRuntimeDependenciesGenerator*>(gen)) {
    return installer;
  }

  // Exclude installers not used in this configuration.
  if (!gen->InstallsForConfig(this->Config)) {
    return installer;
  }

  // Add fields specific to each kind of install generator.
  if (auto* installTarget = dynamic_cast<cmInstallTargetGenerator*>(gen)) {
    cmInstallTargetGenerator::Files const& files =
      installTarget->GetFiles(this->Config);
    if (files.From.empty()) {
      return installer;
    }

    installer["type"] = "target";
    installer["destination"] = installTarget->GetDestination(this->Config);
    installer["targetId"] =
      TargetId(installTarget->GetTarget(), this->TopBuild);
    installer["targetIndex"] =
      this->TargetIndexMap[installTarget->GetTarget()];

    std::string fromDir = files.FromDir;
    if (!fromDir.empty()) {
      fromDir.push_back('/');
    }

    std::string toDir = files.ToDir;
    if (!toDir.empty()) {
      toDir.push_back('/');
    }

    Json::Value paths = Json::arrayValue;
    for (size_t i = 0; i < files.From.size(); ++i) {
      std::string const& fromPath = cmStrCat(fromDir, files.From[i]);
      std::string const& toPath = cmStrCat(toDir, files.To[i]);
      paths.append(this->DumpInstallerPath(this->TopBuild, fromPath, toPath));
    }
    installer["paths"] = std::move(paths);

    if (installTarget->GetOptional()) {
      installer["isOptional"] = true;
    }

    if (installTarget->IsImportLibrary()) {
      installer["targetIsImportLibrary"] = true;
    }

    switch (files.NamelinkMode) {
      case cmInstallTargetGenerator::NamelinkModeNone:
        break;
      case cmInstallTargetGenerator::NamelinkModeOnly:
        installer["targetInstallNamelink"] = "only";
        break;
      case cmInstallTargetGenerator::NamelinkModeSkip:
        installer["targetInstallNamelink"] = "skip";
        break;
    }

    // FIXME: Parse FilePermissions to provide structured information.
    // FIXME: Thread EXPORT name through from install() call.
  } else if (auto* installFiles =
               dynamic_cast<cmInstallFilesGenerator*>(gen)) {
    std::vector<std::string> const& files =
      installFiles->GetFiles(this->Config);
    if (files.empty()) {
      return installer;
    }

    installer["type"] = "file";
    installer["destination"] = installFiles->GetDestination(this->Config);
    Json::Value paths = Json::arrayValue;
    std::string const& rename = installFiles->GetRename(this->Config);
    if (!rename.empty() && files.size() == 1) {
      paths.append(this->DumpInstallerPath(this->TopSource, files[0], rename));
    } else {
      for (std::string const& file : installFiles->GetFiles(this->Config)) {
        paths.append(RelativeIfUnder(this->TopSource, file));
      }
    }
    installer["paths"] = std::move(paths);
    if (installFiles->GetOptional()) {
      installer["isOptional"] = true;
    }
    // FIXME: Parse FilePermissions to provide structured information.
  } else if (auto* installDir =
               dynamic_cast<cmInstallDirectoryGenerator*>(gen)) {
    std::vector<std::string> const& dirs =
      installDir->GetDirectories(this->Config);
    if (dirs.empty()) {
      return installer;
    }

    installer["type"] = "directory";
    installer["destination"] = installDir->GetDestination(this->Config);
    Json::Value paths = Json::arrayValue;
    for (std::string const& dir : dirs) {
      if (cmHasLiteralSuffix(dir, "/")) {
        paths.append(this->DumpInstallerPath(
          this->TopSource, dir.substr(0, dir.size() - 1), "."));
      } else {
        paths.append(this->DumpInstallerPath(
          this->TopSource, dir, cmSystemTools::GetFilenameName(dir)));
      }
    }
    installer["paths"] = std::move(paths);
    if (installDir->GetOptional()) {
      installer["isOptional"] = true;
    }
    // FIXME: Parse FilePermissions, DirPermissions, and LiteralArguments.
    // to provide structured information.
  } else if (auto* installExport =
               dynamic_cast<cmInstallExportGenerator*>(gen)) {
    installer["type"] = "export";
    installer["destination"] = installExport->GetDestination();
    cmExportSet* exportSet = installExport->GetExportSet();
    installer["exportName"] = exportSet->GetName();
    installer["exportTargets"] = this->DumpInstallerExportTargets(exportSet);
    Json::Value paths = Json::arrayValue;
    paths.append(
      RelativeIfUnder(this->TopBuild, installExport->GetMainImportFile()));
    installer["paths"] = std::move(paths);
  } else if (auto* installScript =
               dynamic_cast<cmInstallScriptGenerator*>(gen)) {
    if (installScript->IsCode()) {
      installer["type"] = "code";
    } else {
      installer["type"] = "script";
      installer["scriptFile"] = RelativeIfUnder(
        this->TopSource, installScript->GetScript(this->Config));
    }
  } else if (auto* installImportedRuntimeArtifacts =
               dynamic_cast<cmInstallImportedRuntimeArtifactsGenerator*>(
                 gen)) {
    installer["type"] = "importedRuntimeArtifacts";
    installer["destination"] =
      installImportedRuntimeArtifacts->GetDestination(this->Config);
    if (installImportedRuntimeArtifacts->GetOptional()) {
      installer["isOptional"] = true;
    }
  } else if (auto* installRuntimeDependencySet =
               dynamic_cast<cmInstallRuntimeDependencySetGenerator*>(gen)) {
    installer["type"] = "runtimeDependencySet";
    installer["destination"] =
      installRuntimeDependencySet->GetDestination(this->Config);
    std::string name(
      installRuntimeDependencySet->GetRuntimeDependencySet()->GetName());
    if (!name.empty()) {
      installer["runtimeDependencySetName"] = name;
    }
    switch (installRuntimeDependencySet->GetDependencyType()) {
      case cmInstallRuntimeDependencySetGenerator::DependencyType::Framework:
        installer["runtimeDependencySetType"] = "framework";
        break;
      case cmInstallRuntimeDependencySetGenerator::DependencyType::Library:
        installer["runtimeDependencySetType"] = "library";
        break;
    }
  } else if (auto* installFileSet =
               dynamic_cast<cmInstallFileSetGenerator*>(gen)) {
    installer["type"] = "fileSet";
    installer["destination"] = installFileSet->GetDestination(this->Config);

    auto* fileSet = installFileSet->GetFileSet();
    auto* target = installFileSet->GetTarget();

    auto dirCges = fileSet->CompileDirectoryEntries();
    auto dirs = fileSet->EvaluateDirectoryEntries(
      dirCges, target->GetLocalGenerator(), this->Config, target);

    auto entryCges = fileSet->CompileFileEntries();
    std::map<std::string, std::vector<std::string>> entries;
    for (auto const& entryCge : entryCges) {
      fileSet->EvaluateFileEntry(dirs, entries, entryCge,
                                 target->GetLocalGenerator(), this->Config,
                                 target);
    }

    Json::Value files = Json::arrayValue;
    for (auto const& it : entries) {
      auto dir = it.first;
      if (!dir.empty()) {
        dir += '/';
      }
      for (auto const& file : it.second) {
        files.append(this->DumpInstallerPath(
          this->TopSource, file,
          cmStrCat(dir, cmSystemTools::GetFilenameName(file))));
      }
    }
    installer["paths"] = std::move(files);
    installer["fileSetName"] = fileSet->GetName();
    installer["fileSetType"] = fileSet->GetType();
    installer["fileSetDirectories"] = Json::arrayValue;
    for (auto const& dir : dirs) {
      installer["fileSetDirectories"].append(
        RelativeIfUnder(this->TopSource, dir));
    }
    installer["fileSetTarget"] = Json::objectValue;
    installer["fileSetTarget"]["id"] = TargetId(target, this->TopBuild);
    installer["fileSetTarget"]["index"] = this->TargetIndexMap[target];

    if (installFileSet->GetOptional()) {
      installer["isOptional"] = true;
    }
  } else if (auto* cxxModuleBmi =
               dynamic_cast<cmInstallCxxModuleBmiGenerator*>(gen)) {
    installer["type"] = "cxxModuleBmi";
    installer["destination"] = cxxModuleBmi->GetDestination(this->Config);

    auto const* target = cxxModuleBmi->GetTarget();
    installer["cxxModuleBmiTarget"] = Json::objectValue;
    installer["cxxModuleBmiTarget"]["id"] = TargetId(target, this->TopBuild);
    installer["cxxModuleBmiTarget"]["index"] = this->TargetIndexMap[target];

    // FIXME: Parse FilePermissions.
    // FIXME: Parse MessageLevel.
    if (cxxModuleBmi->GetOptional()) {
      installer["isOptional"] = true;
    }
  }

  // Add fields common to all install generators.
  installer["component"] = gen->GetComponent();
  if (gen->GetExcludeFromAll()) {
    installer["isExcludeFromAll"] = true;
  }

  if (gen->GetAllComponentsFlag()) {
    installer["isForAllComponents"] = true;
  }

  this->AddBacktrace(installer, gen->GetBacktrace());

  return installer;
}